

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_client2.c
# Opt level: O2

void my_debug(void *ctx,int level,char *file,int line,char *str)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = file + 1;
  for (; ((cVar1 = pcVar2[-1], pcVar3 = pcVar2, cVar1 == '/' || (cVar1 == '\\')) ||
         (pcVar3 = file, cVar1 != '\0')); pcVar2 = pcVar2 + 1) {
    file = pcVar3;
  }
  fprintf((FILE *)ctx,"%s:%04d: |%d| %s",file,line,(ulong)(uint)level,str);
  fflush((FILE *)ctx);
  return;
}

Assistant:

static void my_debug( void *ctx, int level,
                      const char *file, int line,
                      const char *str )
{
    const char *p, *basename;

    /* Extract basename from file */
    for( p = basename = file; *p != '\0'; p++ )
        if( *p == '/' || *p == '\\' )
            basename = p + 1;

    mbedtls_fprintf( (FILE *) ctx, "%s:%04d: |%d| %s",
                     basename, line, level, str );
    fflush(  (FILE *) ctx  );
}